

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int CmdCommandVersion(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *__s;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    __s = Abc_UtilsGetVersion(pAbc);
    puts(__s);
  }
  else {
    fwrite("usage: version [-h]\n",0x14,1,(FILE *)pAbc->Err);
    fwrite("         print the version string\n",0x22,1,(FILE *)pAbc->Err);
    fwrite("   -h :  print the command usage\n",0x21,1,(FILE *)pAbc->Err);
  }
  return (uint)(iVar1 != -1);
}

Assistant:

int CmdCommandVersion( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    printf("%s\n", Abc_UtilsGetVersion(pAbc));
    return 0;

usage:
    fprintf( pAbc->Err, "usage: version [-h]\n" );
    fprintf( pAbc->Err, "         print the version string\n" );
    fprintf( pAbc->Err, "   -h :  print the command usage\n");
    return 1;
}